

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O1

int amqpvalue_get_open(AMQP_VALUE value,OPEN_HANDLE *open_handle)

{
  bool bVar1;
  int iVar2;
  AMQP_TYPE AVar3;
  int iVar4;
  OPEN_HANDLE pOVar5;
  AMQP_VALUE pAVar6;
  AMQP_VALUE pAVar7;
  uint32_t list_item_count;
  char *container_id;
  AMQP_VALUE outgoing_locales_array;
  uint local_44;
  AMQP_VALUE local_40;
  AMQP_VALUE local_38;
  
  pOVar5 = (OPEN_HANDLE)malloc(8);
  if (pOVar5 == (OPEN_HANDLE)0x0) {
    *open_handle = (OPEN_HANDLE)0x0;
    iVar4 = 0x2f9;
  }
  else {
    pOVar5->composite_value = (AMQP_VALUE)0x0;
    *open_handle = pOVar5;
    pAVar6 = amqpvalue_get_inplace_described_value(value);
    if (pAVar6 == (AMQP_VALUE)0x0) {
      open_destroy(*open_handle);
      iVar4 = 0x301;
    }
    else {
      iVar2 = amqpvalue_get_list_item_count(pAVar6,&local_44);
      iVar4 = 0x308;
      if (iVar2 == 0) {
        if (local_44 == 0) {
          iVar4 = 0x335;
        }
        else {
          pAVar7 = amqpvalue_get_list_item(pAVar6,0);
          if (pAVar7 == (AMQP_VALUE)0x0) {
            open_destroy(*open_handle);
            iVar4 = 0x317;
          }
          else {
            AVar3 = amqpvalue_get_type(pAVar7);
            if (AVar3 == AMQP_TYPE_NULL) {
              amqpvalue_destroy(pAVar7);
              open_destroy(*open_handle);
              iVar4 = 0x321;
            }
            else {
              iVar4 = amqpvalue_get_string(pAVar7,(char **)&local_40);
              if (iVar4 == 0) {
                amqpvalue_destroy(pAVar7);
                if ((1 < local_44) &&
                   (pAVar7 = amqpvalue_get_list_item(pAVar6,1), pAVar7 != (AMQP_VALUE)0x0)) {
                  AVar3 = amqpvalue_get_type(pAVar7);
                  if ((AVar3 != AMQP_TYPE_NULL) &&
                     (iVar4 = amqpvalue_get_string(pAVar7,(char **)&local_40), iVar4 != 0)) {
                    amqpvalue_destroy(pAVar7);
                    open_destroy(*open_handle);
                    return 0x34d;
                  }
                  amqpvalue_destroy(pAVar7);
                }
                iVar4 = 0x32b;
                if ((2 < local_44) &&
                   (pAVar7 = amqpvalue_get_list_item(pAVar6,2), pAVar7 != (AMQP_VALUE)0x0)) {
                  AVar3 = amqpvalue_get_type(pAVar7);
                  if ((AVar3 != AMQP_TYPE_NULL) &&
                     (iVar2 = amqpvalue_get_uint(pAVar7,(uint32_t *)&local_40), iVar2 != 0)) {
                    amqpvalue_destroy(pAVar7);
                    open_destroy(*open_handle);
                    return 0x36a;
                  }
                  amqpvalue_destroy(pAVar7);
                }
                if ((3 < local_44) &&
                   (pAVar7 = amqpvalue_get_list_item(pAVar6,3), pAVar7 != (AMQP_VALUE)0x0)) {
                  AVar3 = amqpvalue_get_type(pAVar7);
                  if ((AVar3 != AMQP_TYPE_NULL) &&
                     (iVar2 = amqpvalue_get_ushort(pAVar7,(uint16_t *)&local_40), iVar2 != 0)) {
                    amqpvalue_destroy(pAVar7);
                    open_destroy(*open_handle);
                    return 0x387;
                  }
                  amqpvalue_destroy(pAVar7);
                }
                if ((4 < local_44) &&
                   (pAVar7 = amqpvalue_get_list_item(pAVar6,4), pAVar7 != (AMQP_VALUE)0x0)) {
                  AVar3 = amqpvalue_get_type(pAVar7);
                  if ((AVar3 != AMQP_TYPE_NULL) &&
                     (iVar2 = amqpvalue_get_uint(pAVar7,(uint32_t *)&local_40), iVar2 != 0)) {
                    amqpvalue_destroy(pAVar7);
                    open_destroy(*open_handle);
                    return 0x3a4;
                  }
                  amqpvalue_destroy(pAVar7);
                }
                if ((5 < local_44) &&
                   (pAVar7 = amqpvalue_get_list_item(pAVar6,5), pAVar7 != (AMQP_VALUE)0x0)) {
                  AVar3 = amqpvalue_get_type(pAVar7);
                  if (AVar3 != AMQP_TYPE_NULL) {
                    local_40 = (AMQP_VALUE)0x0;
                    AVar3 = amqpvalue_get_type(pAVar7);
                    if (((AVar3 == AMQP_TYPE_ARRAY) &&
                        (iVar2 = amqpvalue_get_array(pAVar7,&local_38), iVar2 == 0)) ||
                       (iVar2 = amqpvalue_get_symbol(pAVar7,(char **)&local_40), iVar2 == 0)) {
                      bVar1 = true;
                    }
                    else {
                      amqpvalue_destroy(pAVar7);
                      open_destroy(*open_handle);
                      iVar4 = 0x3c3;
                      bVar1 = false;
                    }
                    if (!bVar1) {
                      return iVar4;
                    }
                  }
                  amqpvalue_destroy(pAVar7);
                }
                if ((6 < local_44) &&
                   (pAVar7 = amqpvalue_get_list_item(pAVar6,6), pAVar7 != (AMQP_VALUE)0x0)) {
                  AVar3 = amqpvalue_get_type(pAVar7);
                  if (AVar3 != AMQP_TYPE_NULL) {
                    local_40 = (AMQP_VALUE)0x0;
                    AVar3 = amqpvalue_get_type(pAVar7);
                    if (((AVar3 == AMQP_TYPE_ARRAY) &&
                        (iVar2 = amqpvalue_get_array(pAVar7,&local_38), iVar2 == 0)) ||
                       (iVar2 = amqpvalue_get_symbol(pAVar7,(char **)&local_40), iVar2 == 0)) {
                      bVar1 = true;
                    }
                    else {
                      amqpvalue_destroy(pAVar7);
                      open_destroy(*open_handle);
                      iVar4 = 0x3e2;
                      bVar1 = false;
                    }
                    if (!bVar1) {
                      return iVar4;
                    }
                  }
                  amqpvalue_destroy(pAVar7);
                }
                if ((7 < local_44) &&
                   (pAVar7 = amqpvalue_get_list_item(pAVar6,7), pAVar7 != (AMQP_VALUE)0x0)) {
                  AVar3 = amqpvalue_get_type(pAVar7);
                  if (AVar3 != AMQP_TYPE_NULL) {
                    local_40 = (AMQP_VALUE)0x0;
                    AVar3 = amqpvalue_get_type(pAVar7);
                    if (((AVar3 == AMQP_TYPE_ARRAY) &&
                        (iVar2 = amqpvalue_get_array(pAVar7,&local_38), iVar2 == 0)) ||
                       (iVar2 = amqpvalue_get_symbol(pAVar7,(char **)&local_40), iVar2 == 0)) {
                      bVar1 = true;
                    }
                    else {
                      amqpvalue_destroy(pAVar7);
                      open_destroy(*open_handle);
                      iVar4 = 0x401;
                      bVar1 = false;
                    }
                    if (!bVar1) {
                      return iVar4;
                    }
                  }
                  amqpvalue_destroy(pAVar7);
                }
                if ((8 < local_44) &&
                   (pAVar7 = amqpvalue_get_list_item(pAVar6,8), pAVar7 != (AMQP_VALUE)0x0)) {
                  AVar3 = amqpvalue_get_type(pAVar7);
                  if (AVar3 != AMQP_TYPE_NULL) {
                    local_40 = (AMQP_VALUE)0x0;
                    AVar3 = amqpvalue_get_type(pAVar7);
                    if (((AVar3 == AMQP_TYPE_ARRAY) &&
                        (iVar2 = amqpvalue_get_array(pAVar7,&local_38), iVar2 == 0)) ||
                       (iVar2 = amqpvalue_get_symbol(pAVar7,(char **)&local_40), iVar2 == 0)) {
                      bVar1 = true;
                    }
                    else {
                      amqpvalue_destroy(pAVar7);
                      open_destroy(*open_handle);
                      iVar4 = 0x420;
                      bVar1 = false;
                    }
                    if (!bVar1) {
                      return iVar4;
                    }
                  }
                  amqpvalue_destroy(pAVar7);
                }
                if ((9 < local_44) &&
                   (pAVar6 = amqpvalue_get_list_item(pAVar6,9), pAVar6 != (AMQP_VALUE)0x0)) {
                  AVar3 = amqpvalue_get_type(pAVar6);
                  if ((AVar3 != AMQP_TYPE_NULL) &&
                     (iVar4 = amqpvalue_get_map(pAVar6,&local_40), iVar4 != 0)) {
                    amqpvalue_destroy(pAVar6);
                    open_destroy(*open_handle);
                    return 0x43d;
                  }
                  amqpvalue_destroy(pAVar6);
                }
                pAVar6 = amqpvalue_clone(value);
                pOVar5->composite_value = pAVar6;
                iVar4 = 0;
              }
              else {
                amqpvalue_destroy(pAVar7);
                open_destroy(*open_handle);
                iVar4 = 0x32b;
              }
            }
          }
        }
      }
    }
  }
  return iVar4;
}

Assistant:

int amqpvalue_get_open(AMQP_VALUE value, OPEN_HANDLE* open_handle)
{
    int result;
    OPEN_INSTANCE* open_instance = (OPEN_INSTANCE*)open_create_internal();
    *open_handle = open_instance;
    if (*open_handle == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        AMQP_VALUE list_value = amqpvalue_get_inplace_described_value(value);
        if (list_value == NULL)
        {
            open_destroy(*open_handle);
            result = MU_FAILURE;
        }
        else
        {
            uint32_t list_item_count;
            if (amqpvalue_get_list_item_count(list_value, &list_item_count) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                do
                {
                    AMQP_VALUE item_value;
                    /* container-id */
                    if (list_item_count > 0)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 0);
                        if (item_value == NULL)
                        {
                            {
                                open_destroy(*open_handle);
                                result = MU_FAILURE;
                                break;
                            }
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                amqpvalue_destroy(item_value);
                                open_destroy(*open_handle);
                                result = MU_FAILURE;
                                break;
                            }
                            else
                            {
                                const char* container_id;
                                if (amqpvalue_get_string(item_value, &container_id) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    open_destroy(*open_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    else
                    {
                        result = MU_FAILURE;
                        break;
                    }
                    /* hostname */
                    if (list_item_count > 1)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 1);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                const char* hostname;
                                if (amqpvalue_get_string(item_value, &hostname) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    open_destroy(*open_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* max-frame-size */
                    if (list_item_count > 2)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 2);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                uint32_t max_frame_size;
                                if (amqpvalue_get_uint(item_value, &max_frame_size) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    open_destroy(*open_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* channel-max */
                    if (list_item_count > 3)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 3);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                uint16_t channel_max;
                                if (amqpvalue_get_ushort(item_value, &channel_max) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    open_destroy(*open_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* idle-time-out */
                    if (list_item_count > 4)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 4);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                milliseconds idle_time_out;
                                if (amqpvalue_get_milliseconds(item_value, &idle_time_out) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    open_destroy(*open_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* outgoing-locales */
                    if (list_item_count > 5)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 5);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                ietf_language_tag outgoing_locales = NULL;
                                AMQP_VALUE outgoing_locales_array;
                                if (((amqpvalue_get_type(item_value) != AMQP_TYPE_ARRAY) || (amqpvalue_get_array(item_value, &outgoing_locales_array) != 0)) &&
                                    (amqpvalue_get_ietf_language_tag(item_value, &outgoing_locales) != 0))
                                {
                                    amqpvalue_destroy(item_value);
                                    open_destroy(*open_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* incoming-locales */
                    if (list_item_count > 6)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 6);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                ietf_language_tag incoming_locales = NULL;
                                AMQP_VALUE incoming_locales_array;
                                if (((amqpvalue_get_type(item_value) != AMQP_TYPE_ARRAY) || (amqpvalue_get_array(item_value, &incoming_locales_array) != 0)) &&
                                    (amqpvalue_get_ietf_language_tag(item_value, &incoming_locales) != 0))
                                {
                                    amqpvalue_destroy(item_value);
                                    open_destroy(*open_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* offered-capabilities */
                    if (list_item_count > 7)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 7);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                const char* offered_capabilities = NULL;
                                AMQP_VALUE offered_capabilities_array;
                                if (((amqpvalue_get_type(item_value) != AMQP_TYPE_ARRAY) || (amqpvalue_get_array(item_value, &offered_capabilities_array) != 0)) &&
                                    (amqpvalue_get_symbol(item_value, &offered_capabilities) != 0))
                                {
                                    amqpvalue_destroy(item_value);
                                    open_destroy(*open_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* desired-capabilities */
                    if (list_item_count > 8)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 8);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                const char* desired_capabilities = NULL;
                                AMQP_VALUE desired_capabilities_array;
                                if (((amqpvalue_get_type(item_value) != AMQP_TYPE_ARRAY) || (amqpvalue_get_array(item_value, &desired_capabilities_array) != 0)) &&
                                    (amqpvalue_get_symbol(item_value, &desired_capabilities) != 0))
                                {
                                    amqpvalue_destroy(item_value);
                                    open_destroy(*open_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* properties */
                    if (list_item_count > 9)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 9);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                fields properties;
                                if (amqpvalue_get_fields(item_value, &properties) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    open_destroy(*open_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }

                    open_instance->composite_value = amqpvalue_clone(value);

                    result = 0;
                } while(0);
            }
        }
    }

    return result;
}